

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor-read.c
# Opt level: O3

int coda_cursor_read_float(coda_cursor_conflict *cursor,float *dst)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  undefined8 uVar4;
  float fVar5;
  double value;
  coda_native_type read_type;
  coda_conversion *conversion;
  undefined8 local_30;
  coda_native_type local_24;
  coda_conversion *local_20;
  
  if (((cursor == (coda_cursor_conflict *)0x0) || (cursor->n < 1)) ||
     (cursor->stack[cursor->n - 1].type == (coda_dynamic_type_struct *)0x0)) {
    pcVar3 = "invalid cursor argument (%s:%u)";
    uVar4 = 0x947;
LAB_00108c37:
    coda_set_error(-100,pcVar3,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                   ,uVar4);
    return -1;
  }
  if (dst == (float *)0x0) {
    pcVar3 = "dst argument is NULL (%s:%u)";
    uVar4 = 0x94c;
    goto LAB_00108c37;
  }
  get_unconverted_read_type(cursor,&local_24,&local_20);
  if (local_20 != (coda_conversion *)0x0) {
    iVar1 = coda_cursor_read_double(cursor,(double *)&local_30);
    if (iVar1 != 0) {
      return -1;
    }
LAB_00108c11:
    fVar5 = (float)(double)CONCAT44(local_30._4_4_,
                                    CONCAT22(local_30._2_2_,CONCAT11(local_30._1_1_,(byte)local_30))
                                   );
    goto LAB_00108c17;
  }
  switch(local_24) {
  case coda_native_type_int8:
    iVar1 = read_int8(cursor,(int8_t *)&local_30);
    if (iVar1 != 0) {
      return -1;
    }
    uVar2 = (uint)(char)(byte)local_30;
    break;
  case coda_native_type_uint8:
    iVar1 = read_uint8(cursor,(uint8_t *)&local_30);
    if (iVar1 != 0) {
      return -1;
    }
    uVar2 = (uint)(byte)local_30;
    break;
  case coda_native_type_int16:
    iVar1 = read_int16(cursor,(int16_t *)&local_30);
    if (iVar1 != 0) {
      return -1;
    }
    uVar2 = (uint)CONCAT11(local_30._1_1_,(byte)local_30);
    break;
  case coda_native_type_uint16:
    iVar1 = read_uint16(cursor,(uint16_t *)&local_30);
    if (iVar1 != 0) {
      return -1;
    }
    uVar2 = (uint)CONCAT11(local_30._1_1_,(byte)local_30);
    break;
  case coda_native_type_int32:
    iVar1 = read_int32(cursor,(int32_t *)&local_30);
    if (iVar1 != 0) {
      return -1;
    }
    fVar5 = (float)CONCAT22(local_30._2_2_,CONCAT11(local_30._1_1_,(byte)local_30));
    goto LAB_00108c17;
  case coda_native_type_uint32:
    iVar1 = read_uint32(cursor,(uint32_t *)&local_30);
    if (iVar1 != 0) {
      return -1;
    }
    fVar5 = (float)CONCAT22(local_30._2_2_,CONCAT11(local_30._1_1_,(byte)local_30));
    goto LAB_00108c17;
  case coda_native_type_int64:
    iVar1 = read_int64(cursor,&local_30);
    goto LAB_00108d70;
  case coda_native_type_uint64:
    iVar1 = read_uint64(cursor,&local_30);
LAB_00108d70:
    if (iVar1 != 0) {
      return -1;
    }
    fVar5 = (float)CONCAT44(local_30._4_4_,
                            CONCAT22(local_30._2_2_,CONCAT11(local_30._1_1_,(byte)local_30)));
    goto LAB_00108c17;
  case coda_native_type_float:
    iVar1 = read_float(cursor,dst);
    if (iVar1 == 0) {
      return 0;
    }
    return -1;
  case coda_native_type_double:
    iVar1 = read_double(cursor,(double *)&local_30);
    if (iVar1 != 0) {
      return -1;
    }
    goto LAB_00108c11;
  default:
    pcVar3 = coda_type_get_native_type_name(local_24);
    coda_set_error(-0x69,"can not read %s data using a float data type",pcVar3);
    return -1;
  }
  fVar5 = (float)(int)uVar2;
LAB_00108c17:
  *dst = fVar5;
  return 0;
}

Assistant:

LIBCODA_API int coda_cursor_read_float(const coda_cursor *cursor, float *dst)
{
    coda_native_type read_type;
    coda_conversion *conversion;

    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (dst == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "dst argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    if (get_unconverted_read_type(cursor, &read_type, &conversion) != 0)
    {
        return -1;
    }
    if (conversion != NULL)
    {
        double value;

        /* let the conversion be performed by coda_cursor_read_double() and cast the result */
        if (coda_cursor_read_double(cursor, &value) != 0)
        {
            return -1;
        }
        *dst = (float)value;
        return 0;
    }
    switch (read_type)
    {
        case coda_native_type_int8:
            {
                int8_t value;

                if (read_int8(cursor, &value) != 0)
                {
                    return -1;
                }
                *dst = (float)value;
            }
            break;
        case coda_native_type_uint8:
            {
                uint8_t value;

                if (read_uint8(cursor, &value) != 0)
                {
                    return -1;
                }
                *dst = (float)value;
            }
            break;
        case coda_native_type_int16:
            {
                int16_t value;

                if (read_int16(cursor, &value) != 0)
                {
                    return -1;
                }
                *dst = (float)value;
            }
            break;
        case coda_native_type_uint16:
            {
                uint16_t value;

                if (read_uint16(cursor, &value) != 0)
                {
                    return -1;
                }
                *dst = (float)value;
            }
            break;
        case coda_native_type_int32:
            {
                int32_t value;

                if (read_int32(cursor, &value) != 0)
                {
                    return -1;
                }
                *dst = (float)value;
            }
            break;
        case coda_native_type_uint32:
            {
                uint32_t value;

                if (read_uint32(cursor, &value) != 0)
                {
                    return -1;
                }
                *dst = (float)value;
            }
            break;
        case coda_native_type_int64:
            {
                int64_t value;

                if (read_int64(cursor, &value) != 0)
                {
                    return -1;
                }
                *dst = (float)value;
            }
            break;
        case coda_native_type_uint64:
            {
                uint64_t value;

                if (read_uint64(cursor, &value) != 0)
                {
                    return -1;
                }
                *dst = (float)(int64_t)value;
            }
            break;
        case coda_native_type_float:
            if (read_float(cursor, dst) != 0)
            {
                return -1;
            }
            break;
        case coda_native_type_double:
            {
                double value;

                if (read_double(cursor, &value) != 0)
                {
                    return -1;
                }
                *dst = (float)value;
            }
            break;
        default:
            coda_set_error(CODA_ERROR_INVALID_TYPE, "can not read %s data using a float data type",
                           coda_type_get_native_type_name(read_type));
            return -1;
    }

    return 0;
}